

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::SparseTextureAllocationTestCase::verifyTexParameterErrors
          (SparseTextureAllocationTestCase *this,Functions *gl,GLint target,GLint format)

{
  stringstream *log;
  bool bVar1;
  bool bVar2;
  GLenum GVar3;
  GLuint depth;
  GLenum GVar4;
  GLenum *pGVar5;
  GLint value;
  GLuint texture;
  GLint immutableFormat;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> params;
  pair<int,_int> local_58;
  GLuint local_50;
  int local_4c;
  GLenum *local_48;
  GLenum *pGStack_40;
  long local_38;
  
  log = &this->mLog;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->field_0x88,"Verify TexParameter errors - ",0x1d);
  gl4cts::Texture::Generate(gl,&local_50);
  (*gl->bindTexture)(target,local_50);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                  ,0xb5);
  depth = SparseTextureUtils::getTargetDepth(target);
  gl4cts::Texture::Storage(gl,target,1,format,8,8,depth);
  GVar3 = (*gl->getError)();
  bVar1 = SparseTextureUtils::verifyError(log,"TexStorage",GVar3,0);
  if (bVar1) {
    (*gl->getTexParameteriv)(target,0x912f,&local_4c);
    GVar3 = (*gl->getError)();
    bVar1 = false;
    bVar2 = SparseTextureUtils::verifyQueryError(log,"getTexParameteriv",target,0x912f,GVar3,0);
    if ((bVar2) && (bVar1 = true, local_4c == 1)) {
      local_48 = (GLenum *)0x0;
      pGStack_40 = (GLenum *)0x0;
      local_38 = 0;
      local_58.first = 0x91a6;
      local_58.second = 1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_48,
                 &local_58);
      local_58.first = 0x91a7;
      local_58.second = 1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_48,
                 &local_58);
      if (local_48 == pGStack_40) {
        bVar1 = true;
      }
      else {
        bVar1 = true;
        pGVar5 = local_48;
        do {
          if (bVar1 != false) {
            (*gl->texParameteri)(target,*pGVar5,pGVar5[1]);
            GVar3 = *pGVar5;
            GVar4 = (*gl->getError)();
            bVar1 = SparseTextureUtils::verifyQueryError
                              (log,"glTexParameteri",target,GVar3,GVar4,0x502);
          }
          if (bVar1 != false) {
            (*gl->texParameterf)(target,*pGVar5,(float)(int)pGVar5[1]);
            GVar3 = *pGVar5;
            GVar4 = (*gl->getError)();
            bVar1 = SparseTextureUtils::verifyQueryError
                              (log,"glTexParameterf",target,GVar3,GVar4,0x502);
          }
          if (bVar1 != false) {
            local_58.first = pGVar5[1];
            (*gl->texParameteriv)(target,*pGVar5,&local_58.first);
            GVar3 = *pGVar5;
            GVar4 = (*gl->getError)();
            bVar1 = SparseTextureUtils::verifyQueryError
                              (log,"glTexParameteriv",target,GVar3,GVar4,0x502);
          }
          if (bVar1 != false) {
            local_58.first = (int)(float)(int)pGVar5[1];
            (*gl->texParameterfv)(target,*pGVar5,(GLfloat *)&local_58);
            GVar3 = *pGVar5;
            GVar4 = (*gl->getError)();
            bVar1 = SparseTextureUtils::verifyQueryError
                              (log,"glTexParameterfv",target,GVar3,GVar4,0x502);
          }
          if (bVar1 != false) {
            local_58.first = pGVar5[1];
            (*gl->texParameterIiv)(target,*pGVar5,&local_58.first);
            GVar3 = *pGVar5;
            GVar4 = (*gl->getError)();
            bVar1 = SparseTextureUtils::verifyQueryError
                              (log,"glTexParameterIiv",target,GVar3,GVar4,0x502);
          }
          if (bVar1 != false) {
            local_58.first = pGVar5[1];
            (*gl->texParameterIuiv)(target,*pGVar5,(GLuint *)&local_58);
            GVar3 = *pGVar5;
            GVar4 = (*gl->getError)();
            bVar1 = SparseTextureUtils::verifyQueryError
                              (log,"glTexParameterIuiv",target,GVar3,GVar4,0x502);
          }
          pGVar5 = pGVar5 + 2;
        } while (pGVar5 != pGStack_40);
      }
      if (local_48 != (GLenum *)0x0) {
        operator_delete(local_48,local_38 - (long)local_48);
      }
    }
    (*gl->deleteTextures)(1,&local_50);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"GenTextures",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                    ,0xd4);
  }
  else {
    (*gl->deleteTextures)(1,&local_50);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"GenTextures",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                    ,0xd4);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SparseTextureAllocationTestCase::verifyTexParameterErrors(const Functions& gl, GLint target, GLint format)
{
	mLog << "Verify TexParameter errors - ";

	bool result = true;

	GLuint texture;
	GLint  depth;

	Texture::Generate(gl, texture);
	Texture::Bind(gl, texture, target);

	depth = SparseTextureUtils::getTargetDepth(target);

	Texture::Storage(gl, target, 1, format, 8, 8, depth);
	if (!SparseTextureUtils::verifyError(mLog, "TexStorage", gl.getError(), GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	GLint immutableFormat;

	gl.getTexParameteriv(target, GL_TEXTURE_IMMUTABLE_FORMAT, &immutableFormat);
	if (!SparseTextureUtils::verifyQueryError(mLog, "getTexParameteriv", target, GL_TEXTURE_IMMUTABLE_FORMAT,
											  gl.getError(), GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	// Test error only if texture is immutable format, otherwise skip
	if (immutableFormat == GL_TRUE)
	{
		std::vector<IntPair> params;
		params.push_back(IntPair(GL_TEXTURE_SPARSE_ARB, GL_TRUE));
		params.push_back(IntPair(GL_VIRTUAL_PAGE_SIZE_INDEX_ARB, 1));

		for (std::vector<IntPair>::const_iterator iter = params.begin(); iter != params.end(); ++iter)
		{
			const IntPair& param = *iter;

			if (result)
			{
				gl.texParameteri(target, param.first, param.second);
				result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameteri", target, param.first,
															  gl.getError(), GL_INVALID_OPERATION);
			}

			if (result)
			{
				gl.texParameterf(target, param.first, (GLfloat)param.second);
				result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameterf", target, param.first,
															  gl.getError(), GL_INVALID_OPERATION);
			}

			if (result)
			{
				GLint value = param.second;
				gl.texParameteriv(target, param.first, &value);
				result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameteriv", target, param.first,
															  gl.getError(), GL_INVALID_OPERATION);
			}

			if (result)
			{
				GLfloat value = (GLfloat)param.second;
				gl.texParameterfv(target, param.first, &value);
				result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameterfv", target, param.first,
															  gl.getError(), GL_INVALID_OPERATION);
			}

			if (result)
			{
				GLint value = param.second;
				gl.texParameterIiv(target, param.first, &value);
				result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameterIiv", target, param.first,
															  gl.getError(), GL_INVALID_OPERATION);
			}

			if (result)
			{
				GLuint value = param.second;
				gl.texParameterIuiv(target, param.first, &value);
				result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameterIuiv", target, param.first,
															  gl.getError(), GL_INVALID_OPERATION);
			}
		}
	}

	Texture::Delete(gl, texture);
	return result;
}